

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O0

void __thiscall
CommandInInventory::Tick
          (CommandInInventory *this,SBarInfoMainBlock *block,DSBarInfo *statusBar,bool hudChanged)

{
  bool local_42;
  bool local_41;
  AInventory *local_38;
  AInventory *invItem [2];
  bool hudChanged_local;
  DSBarInfo *statusBar_local;
  SBarInfoMainBlock *block_local;
  CommandInInventory *this_local;
  
  SBarInfoCommandFlowControl::Tick((SBarInfoCommandFlowControl *)this,block,statusBar,hudChanged);
  local_38 = AActor::FindInventory
                       (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,this->item[0]
                        ,false);
  invItem[0] = AActor::FindInventory
                         (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,
                          this->item[1],false);
  if (((local_38 != (AInventory *)0x0) && (0 < this->amount[0])) &&
     (local_38->Amount < this->amount[0])) {
    local_38 = (AInventory *)0x0;
  }
  if (((invItem[0] != (AInventory *)0x0) && (0 < this->amount[1])) &&
     (invItem[0]->Amount < this->amount[1])) {
    invItem[0] = (AInventory *)0x0;
  }
  if (this->item[1] == (PClassActor *)0x0) {
    SBarInfoCommandFlowControl::SetTruth
              ((SBarInfoCommandFlowControl *)this,local_38 != (AInventory *)0x0,block,statusBar);
  }
  else if ((this->conditionAnd & 1U) == 0) {
    local_42 = local_38 != (AInventory *)0x0 || invItem[0] != (AInventory *)0x0;
    SBarInfoCommandFlowControl::SetTruth
              ((SBarInfoCommandFlowControl *)this,local_42,block,statusBar);
  }
  else {
    local_41 = local_38 != (AInventory *)0x0 && invItem[0] != (AInventory *)0x0;
    SBarInfoCommandFlowControl::SetTruth
              ((SBarInfoCommandFlowControl *)this,local_41,block,statusBar);
  }
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			SBarInfoNegatableFlowControl::Tick(block, statusBar, hudChanged);

			AInventory *invItem[2] = { statusBar->CPlayer->mo->FindInventory(item[0]), statusBar->CPlayer->mo->FindInventory(item[1]) };
			if (invItem[0] != NULL && amount[0] > 0 && invItem[0]->Amount < amount[0]) invItem[0] = NULL;
			if (invItem[1] != NULL && amount[1] > 0 && invItem[1]->Amount < amount[1]) invItem[1] = NULL;

			if (item[1])
			{
				if (conditionAnd)
					SetTruth(invItem[0] && invItem[1], block, statusBar);
				else
					SetTruth(invItem[0] || invItem[1], block, statusBar);
			}
			else
				SetTruth(invItem[0] != NULL, block, statusBar);
		}